

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprinttobin.cpp
# Opt level: O2

void __thiscall
FootprintToBin::FootprintToBin
          (FootprintToBin *this,int maxIntensityBinIdx,bool hasIntensityUncertainty,
          char *binFileName,char *idxFileName,bool uncompressedSize,bool zip,bool validationCheck)

{
  FILE *pFVar1;
  
  ValidateFootprint::ValidateFootprint(&this->super_ValidateFootprint);
  (this->super_ValidateFootprint)._vptr_ValidateFootprint =
       (_func_int **)&PTR_SetPreviousEventID_00108d00;
  *(int *)&(this->super_ValidateFootprint).field_0x3074 = maxIntensityBinIdx;
  this->hasIntensityUncertainty_ = hasIntensityUncertainty;
  this->uncompressedSize_ = uncompressedSize;
  this->zip_ = zip;
  (this->eventRows_).super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eventRows_).super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eventRows_).super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->fileOutBin_ = (FILE *)0x0;
  this->fileOutIdx_ = (FILE *)0x0;
  this->rowCount_ = 0;
  builtin_strncpy((this->super_ValidateFootprint).super_Validate.fileDescription_,"Footprint",10);
  (this->super_ValidateFootprint).convertToBin_ = true;
  (this->super_ValidateFootprint).validationCheck_ = validationCheck;
  pFVar1 = fopen(binFileName,"wb");
  this->fileOutBin_ = (FILE *)pFVar1;
  pFVar1 = fopen(idxFileName,"wb");
  this->fileOutIdx_ = (FILE *)pFVar1;
  return;
}

Assistant:

FootprintToBin::FootprintToBin(const int maxIntensityBinIdx,
			       const bool hasIntensityUncertainty,
			       const char* binFileName,
			       const char* idxFileName,
			       const bool uncompressedSize, const bool zip,
			       const bool validationCheck) :
  maxIntensityBinIdx_(maxIntensityBinIdx),
  hasIntensityUncertainty_(hasIntensityUncertainty),
  uncompressedSize_(uncompressedSize), zip_(zip) {

  strcpy(fileDescription_, "Footprint");
  convertToBin_ = true;
  validationCheck_ = validationCheck;
  fileOutBin_ = fopen(binFileName, "wb");
  fileOutIdx_ = fopen(idxFileName, "wb");

}